

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResamplerModel.cpp
# Opt level: O1

FloatSampleProvider *
SRCTools::ResamplerModel::createResamplerModel(FloatSampleProvider *source,ResamplerStage *stage)

{
  FloatSampleProvider *pFVar1;
  
  pFVar1 = (FloatSampleProvider *)operator_new(0x8028);
  pFVar1->_vptr_FloatSampleProvider = (_func_int **)&PTR__FloatSampleProvider_00135af8;
  pFVar1[1]._vptr_FloatSampleProvider = (_func_int **)stage;
  pFVar1[2]._vptr_FloatSampleProvider = (_func_int **)source;
  pFVar1[0x1003]._vptr_FloatSampleProvider = (_func_int **)(pFVar1 + 3);
  *(undefined4 *)&pFVar1[0x1004]._vptr_FloatSampleProvider = 0;
  return pFVar1;
}

Assistant:

FloatSampleProvider &ResamplerModel::createResamplerModel(FloatSampleProvider &source, ResamplerStage &stage) {
	return *new CascadeStage(source, stage);
}